

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O3

void __thiscall
Lodtalk::SpecialRuntimeObjects::createSpecialObjectTable(SpecialRuntimeObjects *this)

{
  pointer *ppOVar1;
  VMContext *this_00;
  size_t sVar2;
  pointer pOVar3;
  size_t sVar4;
  iterator iVar5;
  anon_union_8_4_0eb573b0_for_Oop_0 local_28;
  
  this_00 = this->context;
  VMContext::disableGC(this_00);
  local_28.pointer = (uint8_t *)&NilObject;
  ppOVar1 = &(this->specialObjectTable).
             super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
             super__Vector_impl_data._M_finish;
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,std::allocator<Lodtalk::Oop>>::_M_realloc_insert<Lodtalk::Oop_const&>
              ((vector<Lodtalk::Oop,std::allocator<Lodtalk::Oop>> *)this,iVar5,(Oop *)&local_28);
    iVar5._M_current = *ppOVar1;
  }
  else {
    ((iVar5._M_current)->field_0).pointer = (uint8_t *)&NilObject;
    iVar5._M_current = *ppOVar1 + 1;
    *ppOVar1 = iVar5._M_current;
  }
  local_28.pointer = (uint8_t *)&TrueObject;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,std::allocator<Lodtalk::Oop>>::_M_realloc_insert<Lodtalk::Oop_const&>
              ((vector<Lodtalk::Oop,std::allocator<Lodtalk::Oop>> *)this,iVar5,(Oop *)&local_28);
    iVar5._M_current = *ppOVar1;
  }
  else {
    ((iVar5._M_current)->field_0).pointer = (uint8_t *)&TrueObject;
    iVar5._M_current = *ppOVar1 + 1;
    *ppOVar1 = iVar5._M_current;
  }
  local_28.pointer = (uint8_t *)&FalseObject;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,std::allocator<Lodtalk::Oop>>::_M_realloc_insert<Lodtalk::Oop_const&>
              ((vector<Lodtalk::Oop,std::allocator<Lodtalk::Oop>> *)this,iVar5,(Oop *)&local_28);
    pOVar3 = *ppOVar1;
  }
  else {
    ((iVar5._M_current)->field_0).pointer = (uint8_t *)&FalseObject;
    pOVar3 = *ppOVar1 + 1;
    *ppOVar1 = pOVar3;
  }
  this->blockActivationSelectorFirst =
       (long)pOVar3 -
       (long)(this->specialObjectTable).
             super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:value:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:value:value:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:value:value:value:value:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)
             makeSelector(this,"value:value:value:value:value:value:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    pOVar3 = *ppOVar1;
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    pOVar3 = *ppOVar1 + 1;
    *ppOVar1 = pOVar3;
  }
  sVar2 = (long)pOVar3 -
          (long)(this->specialObjectTable).
                super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  this->blockActivationSelectorCount = sVar2 - this->blockActivationSelectorFirst;
  this->specialMessageSelectorFirst = sVar2;
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"+");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"-");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"<");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,">");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"<=");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,">=");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"=");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"~=");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"*");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"/");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"\\\\");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"@");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"bitShift:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"//");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"bitAnd:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"bitOr:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"at:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"at:put:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"size");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"next");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"nextPut:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"atEnd");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"==");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"class");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    iVar5._M_current = *ppOVar1;
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    iVar5._M_current = *ppOVar1 + 1;
    *ppOVar1 = iVar5._M_current;
  }
  local_28.pointer = (uint8_t *)&NilObject;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    ((iVar5._M_current)->field_0).pointer = (uint8_t *)&NilObject;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"value:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"do:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"new");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"new:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"x");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"y");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"basicNew");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"basicNew:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"doesNotUnderstand:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    *ppOVar1 = *ppOVar1 + 1;
  }
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"nativeMethodFailed:");
  iVar5._M_current =
       (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
              (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    pOVar3 = *ppOVar1;
  }
  else {
    (iVar5._M_current)->field_0 = local_28;
    pOVar3 = *ppOVar1 + 1;
    *ppOVar1 = pOVar3;
  }
  sVar2 = (long)pOVar3 -
          (long)(this->specialObjectTable).
                super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  sVar4 = sVar2 - this->specialMessageSelectorFirst;
  this->specialMessageSelectorCount = sVar4;
  if (sVar4 == 0x24) {
    this->compilerMessageSelectorFirst = sVar2;
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifTrue:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifFalse:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifTrue:ifFalse:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifFalse:ifTrue:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNil:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNotNil:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNil:ifNotNil:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"ifNotNil:ifNil:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"whileTrue:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"whileFalse:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"repeat");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"doWhileTrue:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"doWhileFalse:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"to:by:do:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      *ppOVar1 = *ppOVar1 + 1;
    }
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)makeSelector(this,"to:do:");
    iVar5._M_current =
         (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->specialObjectTable).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::_M_realloc_insert<Lodtalk::Oop>
                (&this->specialObjectTable,iVar5,(Oop *)&local_28);
      pOVar3 = *ppOVar1;
    }
    else {
      (iVar5._M_current)->field_0 = local_28;
      pOVar3 = *ppOVar1 + 1;
      *ppOVar1 = pOVar3;
    }
    sVar2 = ((long)pOVar3 -
             (long)(this->specialObjectTable).
                   super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) - this->compilerMessageSelectorFirst;
    this->compilerMessageSelectorCount = sVar2;
    if (sVar2 == 0xf) {
      VMContext::enableGC(this_00);
      return;
    }
    __assert_fail("compilerMessageSelectorCount == (size_t)CompilerOptimizedSelector::CompilerMessageCount"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/SpecialRuntimeObjects.cpp"
                  ,0x7b,"void Lodtalk::SpecialRuntimeObjects::createSpecialObjectTable()");
  }
  __assert_fail("specialMessageSelectorCount == (size_t)SpecialMessageSelector::SpecialMessageCount"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/SpecialRuntimeObjects.cpp"
                ,99,"void Lodtalk::SpecialRuntimeObjects::createSpecialObjectTable()");
}

Assistant:

void SpecialRuntimeObjects::createSpecialObjectTable()
{
    WithoutGC wgc(context);

	specialObjectTable.push_back(nilOop());
	specialObjectTable.push_back(trueOop());
	specialObjectTable.push_back(falseOop());

    // Block activation selectors
    blockActivationSelectorFirst = specialObjectTable.size();
    specialObjectTable.push_back(makeSelector("value"));
    specialObjectTable.push_back(makeSelector("value:"));
    specialObjectTable.push_back(makeSelector("value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:value:value:"));
    specialObjectTable.push_back(makeSelector("value:value:value:value:value:value:"));
    blockActivationSelectorCount = specialObjectTable.size() - blockActivationSelectorFirst;

    // Special message selectors
    specialMessageSelectorFirst = specialObjectTable.size();

    // Arithmetic messages
    specialObjectTable.push_back(makeSelector("+"));
    specialObjectTable.push_back(makeSelector("-"));
    specialObjectTable.push_back(makeSelector("<"));
    specialObjectTable.push_back(makeSelector(">"));
    specialObjectTable.push_back(makeSelector("<="));
    specialObjectTable.push_back(makeSelector(">="));
    specialObjectTable.push_back(makeSelector("="));
    specialObjectTable.push_back(makeSelector("~="));
    specialObjectTable.push_back(makeSelector("*"));
    specialObjectTable.push_back(makeSelector("/"));
    specialObjectTable.push_back(makeSelector("\\\\"));
    specialObjectTable.push_back(makeSelector("@"));
    specialObjectTable.push_back(makeSelector("bitShift:"));
    specialObjectTable.push_back(makeSelector("//"));
    specialObjectTable.push_back(makeSelector("bitAnd:"));
    specialObjectTable.push_back(makeSelector("bitOr:"));

    // Object accessing messages.
    specialObjectTable.push_back(makeSelector("at:"));
    specialObjectTable.push_back(makeSelector("at:put:"));
    specialObjectTable.push_back(makeSelector("size"));
    specialObjectTable.push_back(makeSelector("next"));
    specialObjectTable.push_back(makeSelector("nextPut:"));
    specialObjectTable.push_back(makeSelector("atEnd"));
    specialObjectTable.push_back(makeSelector("=="));
    specialObjectTable.push_back(makeSelector("class"));

    specialObjectTable.push_back(Oop()); // Unassigned

    // Block evaluation.
    specialObjectTable.push_back(makeSelector("value"));
    specialObjectTable.push_back(makeSelector("value:"));
    specialObjectTable.push_back(makeSelector("do:"));

    // Object instantiation.
    specialObjectTable.push_back(makeSelector("new"));
    specialObjectTable.push_back(makeSelector("new:"));
    specialObjectTable.push_back(makeSelector("x"));
    specialObjectTable.push_back(makeSelector("y"));
    specialObjectTable.push_back(makeSelector("basicNew"));
    specialObjectTable.push_back(makeSelector("basicNew:"));

    // Does not understand
    specialObjectTable.push_back(makeSelector("doesNotUnderstand:"));
    specialObjectTable.push_back(makeSelector("nativeMethodFailed:"));

    specialMessageSelectorCount = specialObjectTable.size() - specialMessageSelectorFirst;
    assert(specialMessageSelectorCount == (size_t)SpecialMessageSelector::SpecialMessageCount);

    compilerMessageSelectorFirst = specialObjectTable.size();
    specialObjectTable.push_back(makeSelector("ifTrue:"));
    specialObjectTable.push_back(makeSelector("ifFalse:"));
    specialObjectTable.push_back(makeSelector("ifTrue:ifFalse:"));
    specialObjectTable.push_back(makeSelector("ifFalse:ifTrue:"));
    specialObjectTable.push_back(makeSelector("ifNil:"));
    specialObjectTable.push_back(makeSelector("ifNotNil:"));
    specialObjectTable.push_back(makeSelector("ifNil:ifNotNil:"));
    specialObjectTable.push_back(makeSelector("ifNotNil:ifNil:"));

    // Loops
    specialObjectTable.push_back(makeSelector("whileTrue:"));
    specialObjectTable.push_back(makeSelector("whileFalse:"));
    specialObjectTable.push_back(makeSelector("repeat"));
    specialObjectTable.push_back(makeSelector("doWhileTrue:"));
    specialObjectTable.push_back(makeSelector("doWhileFalse:"));

    // Iteration
    specialObjectTable.push_back(makeSelector("to:by:do:"));
    specialObjectTable.push_back(makeSelector("to:do:"));

    compilerMessageSelectorCount = specialObjectTable.size() - compilerMessageSelectorFirst;
    assert(compilerMessageSelectorCount == (size_t)CompilerOptimizedSelector::CompilerMessageCount);
}